

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

bool deqp::gls::outputTypeIsFloatType(OutputType type)

{
  undefined1 local_9;
  OutputType type_local;
  
  if ((((type == OUTPUTTYPE_FLOAT) || (type == OUTPUTTYPE_VEC2)) || (type == OUTPUTTYPE_VEC3)) ||
     (type == OUTPUTTYPE_VEC4)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool outputTypeIsFloatType (Array::OutputType type)
{
	if (type == Array::OUTPUTTYPE_FLOAT
		|| type == Array::OUTPUTTYPE_VEC2
		|| type == Array::OUTPUTTYPE_VEC3
		|| type == Array::OUTPUTTYPE_VEC4)
		return true;

	return false;
}